

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int rsa_ssh1_public_blob_len(ptrlen data)

{
  mp_int *pmVar1;
  undefined1 local_48 [8];
  BinarySource src [1];
  ptrlen data_local;
  
  src[0].binarysource_ = (BinarySource *)data.ptr;
  BinarySource_INIT__((BinarySource *)local_48,data);
  BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
  pmVar1 = BinarySource_get_mp_ssh1((BinarySource *)src[0]._24_8_);
  mp_free(pmVar1);
  pmVar1 = BinarySource_get_mp_ssh1((BinarySource *)src[0]._24_8_);
  mp_free(pmVar1);
  if (*(int *)(src[0]._24_8_ + 0x18) == 0) {
    data_local.len._4_4_ = (int)src[0].data;
  }
  else {
    data_local.len._4_4_ = -1;
  }
  return data_local.len._4_4_;
}

Assistant:

int rsa_ssh1_public_blob_len(ptrlen data)
{
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, data);

    /* Expect a length word, then exponent and modulus. (It doesn't
     * even matter which order.) */
    get_uint32(src);
    mp_free(get_mp_ssh1(src));
    mp_free(get_mp_ssh1(src));

    if (get_err(src))
        return -1;

    /* Return the number of bytes consumed. */
    return src->pos;
}